

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  DescriptorProto_ExtensionRange *value_01;
  FieldDescriptorProto *pFVar5;
  MessageOptions *value_02;
  OneofDescriptorProto *value_03;
  DescriptorProto_ReservedRange *value_04;
  string *psVar6;
  char *pcVar7;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  DescriptorProto *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_00519c6b:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto switchD_00519e82_default;
    iVar2 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) == 10) {
        psVar6 = mutable_name_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        name_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        name_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar2,PARSE,"google.protobuf.DescriptorProto.name");
        goto LAB_00519c6b;
      }
      break;
    case 2:
      if ((tag_00 & 0xff) != 0x12) break;
      pFVar5 = add_field(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>
                        (input,pFVar5);
      goto joined_r0x0051a130;
    case 3:
      if ((tag_00 & 0xff) == 0x1a) {
        value = add_nested_type(this);
        bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::DescriptorProto>
                          (input,value);
        goto joined_r0x0051a130;
      }
      break;
    case 4:
      if ((tag_00 & 0xff) == 0x22) {
        value_00 = add_enum_type(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value_00);
        goto joined_r0x0051a130;
      }
      break;
    case 5:
      if ((tag_00 & 0xff) == 0x2a) {
        value_01 = add_extension_range(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>
                          (input,value_01);
        goto joined_r0x0051a130;
      }
      break;
    case 6:
      if ((tag_00 & 0xff) == 0x32) {
        pFVar5 = add_extension(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>(input,pFVar5);
        goto joined_r0x0051a130;
      }
      break;
    case 7:
      if ((tag_00 & 0xff) == 0x3a) {
        value_02 = mutable_options(this);
        bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::MessageOptions>
                          (input,value_02);
        goto joined_r0x0051a130;
      }
      break;
    case 8:
      if ((tag_00 & 0xff) == 0x42) {
        value_03 = add_oneof_decl(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::OneofDescriptorProto>(input,value_03);
        goto joined_r0x0051a130;
      }
      break;
    case 9:
      if ((tag_00 & 0xff) == 0x4a) {
        value_04 = add_reserved_range(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::DescriptorProto_ReservedRange>
                          (input,value_04);
        goto joined_r0x0051a130;
      }
      break;
    case 10:
      if ((tag_00 & 0xff) == 0x52) {
        psVar6 = add_reserved_name_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        iVar2 = reserved_name_size(this);
        reserved_name_abi_cxx11_(this,iVar2 + -1);
        pcVar7 = (char *)std::__cxx11::string::data();
        iVar2 = reserved_name_size(this);
        reserved_name_abi_cxx11_(this,iVar2 + -1);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar2,PARSE,"google.protobuf.DescriptorProto.reserved_name");
        goto LAB_00519c6b;
      }
    }
switchD_00519e82_default:
    if ((tag_00 == 0) ||
       (WVar3 = internal::WireFormatLite::GetTagWireType(tag_00), WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = internal::WireFormat::SkipField(input,tag_00,unknown_fields);
joined_r0x0051a130:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.DescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_oneof_decl()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_reserved_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string reserved_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_reserved_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->reserved_name(this->reserved_name_size() - 1).data(),
            this->reserved_name(this->reserved_name_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.reserved_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.DescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.DescriptorProto)
  return false;
#undef DO_
}